

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddPropertyIdsForScopeSlotArray
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,ParseableFunctionInfo *function)

{
  uint uVar1;
  PropertyId value;
  uint32 uVar2;
  int *piVar3;
  uint32 uVar4;
  uint i;
  ulong uVar5;
  
  uVar1 = function->scopeSlotArraySize;
  if (uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
      piVar3 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)13,int*>
                         (&function->super_FunctionProxy);
      value = encodePossiblyBuiltInPropertyId(this,piVar3[uVar5]);
      uVar2 = PrependInt32(this,builder,L"PropertyIdsForScopeSlots",value,(BufferBuilderInt32 **)0x0
                          );
      uVar4 = uVar4 + uVar2;
      uVar1 = function->scopeSlotArraySize;
    }
  }
  return uVar4;
}

Assistant:

uint32 AddPropertyIdsForScopeSlotArray(BufferBuilderList & builder, ParseableFunctionInfo* function)
    {
        if (function->scopeSlotArraySize == 0)
        {
            return 0;
        }
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start PropertyIdsForScopeSlotsArray"), magicStartOfPropertyIdsForScopeSlotArray);
#endif

        for (uint i = 0; i < function->scopeSlotArraySize; i++)
        {
            PropertyId propertyId = encodePossiblyBuiltInPropertyId(function->GetPropertyIdsForScopeSlotArray()[i]);
            size += PrependInt32(builder, _u("PropertyIdsForScopeSlots"), propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End PropertyIdsForScopeSlotsArray"), magicEndOfPropertyIdsForScopeSlotArray);
#endif

        return size;
    }